

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::EndGlobalInitExpr
          (BinaryReaderInterp *this,Index index)

{
  SharedValidator *this_00;
  pointer pGVar1;
  u64 uVar2;
  undefined4 uVar3;
  Enum EVar4;
  Result RVar5;
  Type actual;
  Var *this_01;
  Location LStack_d8;
  Var local_b0;
  Var local_68;
  
  this_00 = &this->validator_;
  switch((this->init_expr_).kind) {
  case I32:
    actual.enum_ = I32;
    break;
  case I64:
    actual.enum_ = I64;
    break;
  case F32:
    actual.enum_ = F32;
    break;
  case F64:
    actual.enum_ = F64;
    break;
  case V128:
    actual.enum_ = V128;
    break;
  case GlobalGet:
    LStack_d8.field_1.field_0.line = 0;
    LStack_d8.field_1._4_8_ = 0;
    LStack_d8.filename.data_ = (char *)0x0;
    LStack_d8.filename.size_._0_4_ = 0;
    LStack_d8.filename.size_._4_4_ = 0;
    this_01 = &local_68;
    Var::Var(this_01,(this->init_expr_).field_1.i32_,&LStack_d8);
    RVar5 = SharedValidator::OnGlobalInitExpr_GlobalGet
                      (this_00,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,this_01);
    goto LAB_0014dc27;
  case RefNull:
    RVar5 = SharedValidator::OnGlobalInitExpr_RefNull
                      (this_00,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                       (Type)(this->init_expr_).field_1.type_.enum_);
    goto LAB_0014dbb8;
  case RefFunc:
    LStack_d8.field_1.field_0.line = 0;
    LStack_d8.field_1._4_8_ = 0;
    LStack_d8.filename.data_ = (char *)0x0;
    LStack_d8.filename.size_._0_4_ = 0;
    LStack_d8.filename.size_._4_4_ = 0;
    this_01 = &local_b0;
    Var::Var(this_01,(this->init_expr_).field_1.i32_,&LStack_d8);
    RVar5 = SharedValidator::OnGlobalInitExpr_RefFunc
                      (this_00,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,this_01);
LAB_0014dc27:
    Var::~Var(this_01);
    if (RVar5.enum_ == Error) {
      return (Result)Error;
    }
    goto LAB_0014dbc4;
  default:
    RVar5 = SharedValidator::OnGlobalInitExpr_Other
                      (this_00,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
    goto LAB_0014dbb8;
  }
  RVar5 = SharedValidator::OnGlobalInitExpr_Const
                    (this_00,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,actual);
LAB_0014dbb8:
  EVar4 = Error;
  if (RVar5.enum_ != Error) {
LAB_0014dbc4:
    pGVar1 = (this->module_->globals).
             super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *(undefined8 *)((long)&pGVar1[-1].init.field_1 + 8) =
         *(undefined8 *)((long)&(this->init_expr_).field_1 + 8);
    uVar3 = *(undefined4 *)&(this->init_expr_).field_0x4;
    uVar2 = (this->init_expr_).field_1.i64_;
    pGVar1[-1].init.kind = (this->init_expr_).kind;
    *(undefined4 *)&pGVar1[-1].init.field_0x4 = uVar3;
    pGVar1[-1].init.field_1.i64_ = uVar2;
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::EndGlobalInitExpr(Index index) {
  switch (init_expr_.kind) {
    case InitExprKind::I32:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::I32));
      break;

    case InitExprKind::I64:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::I64));
      break;

    case InitExprKind::F32:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::F32));
      break;

    case InitExprKind::F64:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::F64));
      break;

    case InitExprKind::V128:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::V128));
      break;

    case InitExprKind::GlobalGet:
      CHECK_RESULT(
          validator_.OnGlobalInitExpr_GlobalGet(loc, Var(init_expr_.index_)));
      break;

    case InitExprKind::RefNull:
      CHECK_RESULT(validator_.OnGlobalInitExpr_RefNull(loc, init_expr_.type_));
      break;

    case InitExprKind::RefFunc:
      CHECK_RESULT(
          validator_.OnGlobalInitExpr_RefFunc(loc, Var(init_expr_.index_)));
      break;

    default:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Other(loc));
      break;
  }

  GlobalDesc& global = module_.globals.back();
  global.init = init_expr_;
  return Result::Ok;
}